

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

FunctionDeclarationSyntax * __thiscall
slang::parsing::Parser::parseFunctionDeclaration
          (Parser *this,AttrList attributes,SyntaxKind functionKind,TokenKind endKind,
          SyntaxKind parentKind,bitmask<slang::parsing::detail::FunctionOptions> options)

{
  Token end_00;
  FunctionPrototypeSyntax *prototype;
  NamedBlockClauseSyntax *endBlock;
  FunctionDeclarationSyntax *pFVar1;
  Token TVar2;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> sVar3;
  Token semi;
  bool isConstructor;
  Token end;
  bool local_dd;
  SyntaxKind local_dc;
  SyntaxNode *local_d8;
  Info *local_d0;
  undefined8 local_c8;
  pointer local_c0;
  size_t local_b8;
  Token local_b0;
  SyntaxList<slang::syntax::SyntaxNode> local_a0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  local_b8 = (size_t)attributes._M_extent._M_extent_value;
  local_c0 = attributes._M_ptr;
  local_dc = functionKind;
  Token::Token(&local_b0);
  prototype = parseFunctionPrototype
                        (this,parentKind,
                         (bitmask<slang::parsing::detail::FunctionOptions>)(options.m_bits | 1),
                         &local_dd);
  local_d8 = this->previewNode;
  this->previewNode = (SyntaxNode *)0x0;
  TVar2 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_d0 = TVar2.info;
  local_c8 = TVar2._0_8_;
  sVar3 = parseBlockItems(this,endKind,&local_b0,local_dd);
  endBlock = parseNamedBlockClause(this);
  TVar2 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(prototype->name).ptr);
  if ((TVar2.kind == NewKeyword) || (TVar2.kind == Identifier)) {
    checkBlockNames(this,TVar2,endBlock);
  }
  this->previewNode = local_d8;
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.childCount = local_b8;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_c0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_b8;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623138;
  local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006239c0;
  end_00.info = local_b0.info;
  end_00.kind = local_b0.kind;
  end_00._2_1_ = local_b0._2_1_;
  end_00.numFlags.raw = local_b0.numFlags.raw;
  end_00.rawLen = local_b0.rawLen;
  semi.info = local_d0;
  semi.kind = (undefined2)local_c8;
  semi._2_1_ = local_c8._2_1_;
  semi.numFlags.raw = local_c8._3_1_;
  semi.rawLen = local_c8._4_4_;
  local_a0.super_SyntaxListBase.childCount = sVar3._M_extent._M_extent_value._M_extent_value;
  local_a0.super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> = sVar3;
  pFVar1 = slang::syntax::SyntaxFactory::functionDeclaration
                     (&this->factory,local_dc,&local_68,prototype,semi,&local_a0,end_00,endBlock);
  return pFVar1;
}

Assistant:

FunctionDeclarationSyntax& Parser::parseFunctionDeclaration(AttrList attributes,
                                                            SyntaxKind functionKind,
                                                            TokenKind endKind,
                                                            SyntaxKind parentKind,
                                                            bitmask<FunctionOptions> options) {
    Token end;
    bool isConstructor;
    auto& prototype = parseFunctionPrototype(parentKind,
                                             options | FunctionOptions::AllowImplicitReturn,
                                             &isConstructor);

    // If the function returns a declared enum type, save it off here
    // so that we don't suck it into the body.
    auto savedPN = std::exchange(previewNode, nullptr);

    auto semi = expect(TokenKind::Semicolon);
    auto items = parseBlockItems(endKind, end, isConstructor);
    auto endBlockName = parseNamedBlockClause();

    Token nameToken = prototype.name->getLastToken();
    if (nameToken.kind == TokenKind::Identifier || nameToken.kind == TokenKind::NewKeyword)
        checkBlockNames(nameToken, endBlockName);

    previewNode = savedPN;
    return factory.functionDeclaration(functionKind, attributes, prototype, semi, items, end,
                                       endBlockName);
}